

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day23.cpp
# Opt level: O2

int64_t __thiscall anon_unknown.dwarf_9fdf0::Region::solve_distance(Region *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  long __tmp;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  int64_t candidates;
  long lVar9;
  long lVar10;
  long lVar11;
  ulong uStack_50;
  array<std::pair<long,_long>,_4UL> H;
  
  H._M_elems[0].first = (this->R)._M_elems[0].first;
  H._M_elems[0].second = (this->R)._M_elems[0].second;
  H._M_elems[1].first = (this->R)._M_elems[1].first;
  H._M_elems[1].second = (this->R)._M_elems[1].second;
  H._M_elems[2].first = (this->R)._M_elems[2].first;
  H._M_elems[2].second = (this->R)._M_elems[2].second;
  H._M_elems[3].first = (this->R)._M_elems[3].first;
  H._M_elems[3].second = (this->R)._M_elems[3].second;
  for (lVar2 = 8; lVar2 != 0x38; lVar2 = lVar2 + 0x10) {
    uVar7 = *(ulong *)((long)&H._M_elems[0].first + lVar2);
    uVar4 = *(ulong *)((long)&uStack_50 + lVar2);
    uVar6 = -uVar7;
    if (0 < (long)uVar7) {
      uVar6 = uVar7;
    }
    uVar8 = -uVar4;
    if (0 < (long)uVar4) {
      uVar8 = uVar4;
    }
    if (uVar6 < uVar8) {
      *(ulong *)((long)&uStack_50 + lVar2) = uVar7;
      *(ulong *)((long)&H._M_elems[0].first + lVar2) = uVar4;
    }
  }
  lVar2 = H._M_elems[1].first + H._M_elems[0].first + H._M_elems[2].first;
  uVar7 = H._M_elems[3].first - lVar2;
  if (uVar7 == 0 || H._M_elems[3].first < lVar2) {
    uVar7 = H._M_elems[3].second - lVar2;
    if (H._M_elems[3].second < lVar2) {
      H._M_elems[3].first = H._M_elems[3].second;
    }
    else {
      uVar7 = 0;
      H._M_elems[3].first = lVar2;
    }
  }
  lVar2 = 0;
  for (lVar3 = 0; lVar3 != 0x40; lVar3 = lVar3 + 0x10) {
    lVar5 = *(long *)((long)&H._M_elems[0].first + lVar3);
    lVar9 = -lVar5;
    if (0 < lVar5) {
      lVar9 = lVar5;
    }
    if (lVar2 <= lVar9) {
      lVar2 = lVar9;
    }
  }
  do {
    lVar3 = -lVar2;
    do {
      if (uVar7 == 0) {
        return lVar2;
      }
      lVar9 = 0;
      for (lVar5 = 0; lVar5 != 0x30; lVar5 = lVar5 + 0x10) {
        lVar1 = *(long *)((long)&H._M_elems[0].second + lVar5);
        if ((long)uVar7 < 1) {
          if (lVar1 < 0) {
            lVar11 = *(long *)((long)&H._M_elems[0].first + lVar5);
            lVar10 = lVar3;
            if (lVar1 != lVar3 && SBORROW8(lVar1,lVar3) == lVar1 + lVar2 < 0) {
              lVar10 = lVar1;
            }
            uVar4 = lVar10 - lVar11;
            if (lVar10 - lVar11 <= (long)uVar7) {
              uVar4 = uVar7;
            }
            goto LAB_001100fe;
          }
        }
        else if (0 < lVar1) {
          lVar11 = *(long *)((long)&H._M_elems[0].first + lVar5);
          lVar10 = lVar2;
          if (lVar1 < lVar2) {
            lVar10 = lVar1;
          }
          uVar4 = lVar10 - lVar11;
          if ((long)uVar7 < lVar10 - lVar11) {
            uVar4 = uVar7;
          }
LAB_001100fe:
          uVar7 = uVar7 - uVar4;
          *(ulong *)((long)&H._M_elems[0].first + lVar5) = lVar11 + uVar4;
          lVar9 = lVar9 + (ulong)(lVar11 + uVar4 != lVar1);
        }
      }
    } while (uVar7 == 0);
    if (lVar9 == 0) {
      return 0x7fffffffffffffff;
    }
    uVar4 = -uVar7;
    if (0 < (long)uVar7) {
      uVar4 = uVar7;
    }
    lVar2 = lVar2 + ((long)(lVar9 + -1 + (uVar4 >> 1)) / lVar9) * 2;
  } while( true );
}

Assistant:

int64_t solve_distance() const {
		auto H = R;

		// Put ranges R[0..2] in absolute value order
		for (int i = 0; i < 3; i++) {
			auto& r = H[i];
			if (labs(r.second) < labs(r.first)) {
				std::swap(r.first, r.second);
			}
		}

		// Get initial value for the sum (N0 + N1 + N2)
		auto sum = H[0].first + H[1].first + H[2].first;
		int64_t delta = 0;
		if (sum < H[3].first) {
			delta = H[3].first - sum;  // Too low
		} else if (sum > H[3].second) {
			delta = H[3].second - sum; // Too high
			H[3].first = H[3].second;
		} else {
			H[3].first = sum;          // Just right
		}

		// Get initial distance to origin
		int64_t dist = 0;
		for (auto&& r : H) {
			dist = std::max(dist, labs(r.first));
		}

		while (delta) {
			int64_t candidates = 0;
			for (int i = 0; i < 3; i++) {
				// Adjust H[0..2] as far as possible without affecting
				// distance to origin
				int64_t step = 0;
				if (delta > 0) {
					if (H[i].second <= 0) continue; // wrong direction
					auto slack = std::min( dist, H[i].second) - H[i].first;
					step = std::min(slack, delta);
				} else {
					if (H[i].second >= 0) continue; // wrong direction
					auto slack = std::max(-dist, H[i].second) - H[i].first;
					step = std::max(slack, delta);
				}
				H[i].first += step;
				delta -= step;
				// Keep track of how many variables still have adjustment room
				if (H[i].first != H[i].second) {
					candidates++;
				}
			}
			if (delta) {
				if (!candidates) {
					// No solution
					return INT64_MAX;
				}
				/* Increase distance-to-origin by the minimum amount which
				 * would satisfy the remaining delta, assuming all candidates
				 * have sufficient slack.  (This may underestimate, in which
				 * case it will loop again with a smaller candidate count.)
				 * Distance must be raised in even increments.
				 */
				dist += (((labs(delta) / 2) + (candidates - 1)) / candidates) * 2;
			}
		}

		return dist;
	}